

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall benchmark::State::SkipWithError(State *this,char *msg)

{
  int *piVar1;
  TimerManager *this_00;
  unique_lock<std::mutex> uStack_28;
  error_message_type expected_no_error_msg;
  
  if (msg != (char *)0x0) {
    internal::GetNullLogInstance();
    this->error_occurred_ = true;
    expected_no_error_msg = (error_message_type)0x0;
    std::atomic<const_char_*>::compare_exchange_weak
              ((atomic<const_char_*> *)&(anonymous_namespace)::error_message,&expected_no_error_msg,
               msg,memory_order_seq_cst);
    this->started_ = true;
    this->finished_ = true;
    this->total_iterations_ = this->max_iterations;
    this_00 = (anonymous_namespace)::timer_manager;
    std::unique_lock<std::mutex>::unique_lock
              (&uStack_28,(mutex_type *)(anonymous_namespace)::timer_manager);
    piVar1 = &this_00->running_threads_;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      if (this_00->running_ == true) {
        anon_unknown_1::TimerManager::InternalStop(this_00);
      }
    }
    else {
      std::condition_variable::notify_all();
    }
    std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
    return;
  }
  internal::CheckHandler::CheckHandler
            ((CheckHandler *)&uStack_28,"msg",
             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
             ,"SkipWithError",0x3e3);
  internal::CheckHandler::~CheckHandler((CheckHandler *)&uStack_28);
}

Assistant:

void State::SkipWithError(const char* msg) {
  CHECK(msg);
  error_occurred_ = true;
  error_message_type expected_no_error_msg = nullptr;
  error_message.compare_exchange_weak(expected_no_error_msg,
    const_cast<error_message_type>(msg));
  started_ = finished_ = true;
  total_iterations_ = max_iterations;
  timer_manager->RemoveErroredThread();
}